

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_sync_receive_and_store_pdus(rtr_socket *rtr_socket)

{
  size_t size;
  long lVar1;
  int iVar2;
  pfx_table *ppVar3;
  pdu_aspa **pppVar4;
  pdu_aspa *__dest;
  pdu_router_key *ppVar5;
  pfx_table *pfx_table;
  spki_table *extraout_RAX;
  size_t sVar6;
  spki_table *extraout_RAX_00;
  spki_table *spki_table;
  undefined8 uVar7;
  uint16_t minimum;
  pfx_table *ppVar8;
  uint router_key_pdu_count;
  uint pdu_size;
  pfx_table *ppVar9;
  uint uVar10;
  rtr_socket_state new_state;
  rtr_socket *unaff_RBP;
  uint32_t maximum;
  uint *ind;
  uint *size_00;
  uint *aspa_table;
  long in_FS_OFFSET;
  recv_loop_cleanup_args cleanup_args;
  int oldcancelstate;
  size_t aspa_pdus_count;
  pdu_aspa **aspa_pdus;
  pdu_router_key *router_key_pdus;
  uint ipv4_pdus_nindex;
  uint ipv4_pdus_size;
  pdu_ipv4 *ipv4_pdus;
  uint ipv6_pdus_size;
  uint ipv6_pdus_nindex;
  pdu_ipv6 *ipv6_pdus;
  undefined1 auStack_100a8 [65536];
  __pthread_unwind_buf_t __cancel_buf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cleanup_args.ipv6_pdus = &ipv6_pdus;
  ipv6_pdus = (pdu_ipv6 *)0x0;
  ipv6_pdus_nindex = 0;
  ipv6_pdus_size = 0;
  cleanup_args.ipv4_pdus = &ipv4_pdus;
  ipv4_pdus = (pdu_ipv4 *)0x0;
  ipv4_pdus_size = 0;
  ipv4_pdus_nindex = 0;
  cleanup_args.router_key_pdus = &router_key_pdus;
  router_key_pdus = (pdu_router_key *)0x0;
  cleanup_args.aspa_pdus = &aspa_pdus;
  aspa_pdus = (pdu_aspa **)0x0;
  cleanup_args.aspa_pdu_count = &aspa_pdus_count;
  aspa_pdus_count = 0;
  pfx_table = (pfx_table *)0x0;
  aspa_table = &switchD_00109fc7::switchdataD_00114fac;
  ppVar3 = pfx_table;
  ppVar8 = pfx_table;
  ppVar9 = pfx_table;
LAB_00109f3f:
  router_key_pdu_count = (uint)ppVar9;
  uVar10 = (uint)ppVar8;
LAB_00109f4c:
  iVar2 = __sigsetjmp((__pthread_unwind_buf_t *)&__cancel_buf);
  if (iVar2 != 0) {
    recv_loop_cleanup(&cleanup_args);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_buf);
    ppVar8 = (pfx_table *)&oldcancelstate;
LAB_0010a40e:
    spki_table = (spki_table *)lrtr_malloc(0x170);
    if (spki_table == (spki_table *)0x0) {
      lrtr_dbg("RTR Socket: Memory allocation for spki shadow table failed");
      iVar2 = -1;
      spki_table = (spki_table *)0x0;
    }
    else {
      spki_table_init(spki_table,(spki_update_fp)0x0);
      iVar2 = spki_table_copy_except_socket(rtr_socket->spki_table,spki_table,rtr_socket);
      if (iVar2 == 0) {
        aspa_table = (uint *)lrtr_malloc(0x80);
        if ((spki_table *)aspa_table == (spki_table *)0x0) {
          aspa_table = (uint *)0x0;
          lrtr_dbg("RTR Socket: Memory allocation for aspa shadow table failed");
          iVar2 = -1;
        }
        else {
          aspa_table_init((aspa_table *)aspa_table,(aspa_update_fp)0x0);
          lrtr_dbg("RTR Socket: Shadow tables created");
          iVar2 = rtr_sync_update_tables
                            (unaff_RBP,ppVar8,spki_table,(aspa_table *)aspa_table,ipv4_pdus,
                             ipv4_pdus_nindex,ipv6_pdus,ipv6_pdus_nindex,router_key_pdus,
                             router_key_pdu_count,aspa_pdus,aspa_pdus_count,
                             (pdu_end_of_data_v0 *)auStack_100a8);
          if (iVar2 == 0) {
            lrtr_dbg("RTR Socket: Reset finished. Swapping new table in.");
            pfx_table_swap(unaff_RBP->pfx_table,ppVar8);
            spki_table_swap(unaff_RBP->spki_table,spki_table);
            lrtr_dbg("RTR Socket: Replacing ASPA records");
            aspa_table_src_replace
                      (unaff_RBP->aspa_table,(aspa_table *)aspa_table,unaff_RBP,
                       unaff_RBP->aspa_table->update_fp != (aspa_update_fp)0x0,false);
            if (unaff_RBP->pfx_table->update_fp == (pfx_update_fp)0x0) {
              lrtr_dbg("RTR Socket: No pfx update callback. Skipping diff");
            }
            else {
              lrtr_dbg("RTR Socket: Calculating and notifying pfx diff");
              pfx_table_notify_diff(unaff_RBP->pfx_table,ppVar8,unaff_RBP);
            }
            if (unaff_RBP->spki_table->update_fp == (spki_update_fp)0x0) {
              iVar2 = 0;
              lrtr_dbg("RTR Socket: No spki update callback. Skipping diff");
            }
            else {
              lrtr_dbg("RTR Socket: Calculating and notifying spki diff");
              spki_table_notify_diff(unaff_RBP->spki_table,spki_table,unaff_RBP);
              iVar2 = 0;
            }
          }
          else {
            iVar2 = -1;
          }
        }
      }
      else {
        lrtr_dbg("RTR Socket: Creation of spki shadow table failed");
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        iVar2 = -1;
        aspa_table = (uint *)spki_table;
      }
    }
LAB_0010a37e:
    lrtr_dbg("RTR Socket: Freeing shadow tables.");
    if (pfx_table != (pfx_table *)0x0) {
      pfx_table_free_without_notify(ppVar8);
      lrtr_free(ppVar8);
    }
    if (spki_table != (spki_table *)0x0) {
      spki_table_free_without_notify(spki_table);
      lrtr_free(spki_table);
    }
    if ((spki_table *)aspa_table != (spki_table *)0x0) {
      aspa_table_free((aspa_table *)aspa_table,false);
      lrtr_free(aspa_table);
    }
    unaff_RBP->is_resetting = false;
    goto LAB_0010a532;
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
  pthread_setcancelstate(0,&oldcancelstate);
  iVar2 = rtr_receive_pdu(rtr_socket,auStack_100a8,0x3c,(time_t)ppVar8);
  pthread_setcancelstate(1,&oldcancelstate);
  __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
  if (iVar2 == -2) {
    new_state = RTR_ERROR_TRANSPORT;
    goto LAB_0010a52a;
  }
  if (iVar2 < 0) goto LAB_0010a52f;
  if (0xb < (ulong)(byte)auStack_100a8[1]) {
switchD_00109fc7_caseD_1:
    lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",(ulong)(byte)auStack_100a8[1]);
    rtr_send_error_pdu_from_host
              (rtr_socket,auStack_100a8,8,CORRUPT_DATA,
               "Unexpected PDU received during data synchronisation",0x34);
    goto LAB_0010a52f;
  }
  ppVar8 = (pfx_table *)
           ((long)&switchD_00109fc7::switchdataD_00114fac +
           (long)(int)(&switchD_00109fc7::switchdataD_00114fac)[(byte)auStack_100a8[1]]);
  unaff_RBP = rtr_socket;
  switch(auStack_100a8[1]) {
  case 0:
    lrtr_dbg("RTR Socket: Ignoring Serial Notify");
    goto LAB_00109f4c;
  default:
    goto switchD_00109fc7_caseD_1;
  case 4:
    pdu_size = 0x14;
    ppVar8 = (pfx_table *)&ipv4_pdus;
    ind = &ipv4_pdus_nindex;
    size_00 = &ipv4_pdus_size;
    break;
  case 6:
    pdu_size = 0x20;
    ppVar8 = (pfx_table *)&ipv6_pdus;
    ind = &ipv6_pdus_nindex;
    size_00 = &ipv6_pdus_size;
    break;
  case 7:
    lrtr_dbg("RTR Socket: EOD PDU received.");
    if (rtr_socket->session_id != (uint)(ushort)auStack_100a8._2_2_) {
      snprintf((char *)&__cancel_buf,0x43,
               "Expected session_id: %u, received session_id. %u in EOD PDU");
      sVar6 = strlen((char *)&__cancel_buf);
      rtr_send_error_pdu_from_host
                (rtr_socket,auStack_100a8,0xffff,CORRUPT_DATA,(char *)&__cancel_buf,(int)sVar6 + 1);
      new_state = RTR_ERROR_FATAL;
      goto LAB_0010a52a;
    }
    if (((byte)(auStack_100a8[0] - 1) < 2) && (rtr_socket->iv_mode != RTR_INTERVAL_MODE_IGNORE_ANY))
    {
      iVar2 = rtr_check_interval_option
                        (rtr_socket,rtr_socket->iv_mode,auStack_100a8._20_4_,
                         RTR_INTERVAL_TYPE_EXPIRATION);
      if (iVar2 == -1) {
        minimum = 600;
        maximum = 0x2a300;
        auStack_100a8._16_4_ = auStack_100a8._20_4_;
      }
      else {
        iVar2 = rtr_check_interval_option
                          (rtr_socket,rtr_socket->iv_mode,auStack_100a8._12_4_,
                           RTR_INTERVAL_TYPE_REFRESH);
        if (iVar2 == -1) {
          minimum = 1;
          maximum = 0x15180;
          auStack_100a8._16_4_ = auStack_100a8._12_4_;
        }
        else {
          iVar2 = rtr_check_interval_option
                            (rtr_socket,rtr_socket->iv_mode,auStack_100a8._16_4_,
                             RTR_INTERVAL_TYPE_RETRY);
          if (iVar2 != -1) {
            lrtr_dbg("RTR Socket: New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u"
                     ,(ulong)rtr_socket->expire_interval,(ulong)rtr_socket->refresh_interval,
                     (ulong)rtr_socket->retry_interval);
            goto LAB_0010a1fa;
          }
          minimum = 1;
          maximum = 0x1c20;
        }
      }
      interval_send_error_pdu(rtr_socket,auStack_100a8,auStack_100a8._16_4_,minimum,maximum);
      goto LAB_0010a52f;
    }
LAB_0010a1fa:
    if (rtr_socket->is_resetting == true) {
      lrtr_dbg("RTR Socket: Reset in progress creating shadow table for atomic reset");
      pfx_table = (pfx_table *)lrtr_malloc(0x50);
      ppVar8 = pfx_table;
      if (pfx_table == (pfx_table *)0x0) {
        lrtr_dbg("RTR Socket: Memory allocation for pfx shadow table failed");
        spki_table = extraout_RAX_00;
      }
      else {
        pfx_table_init(pfx_table,(pfx_update_fp)0x0);
        iVar2 = pfx_table_copy_except_socket(rtr_socket->pfx_table,pfx_table,rtr_socket);
        if (iVar2 == 0) goto LAB_0010a40e;
        lrtr_dbg("RTR Socket: Creation of pfx shadow table failed");
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        spki_table = extraout_RAX;
      }
      iVar2 = -1;
      goto LAB_0010a37e;
    }
    iVar2 = rtr_sync_update_tables
                      (rtr_socket,rtr_socket->pfx_table,rtr_socket->spki_table,
                       rtr_socket->aspa_table,ipv4_pdus,ipv4_pdus_nindex,ipv6_pdus,ipv6_pdus_nindex,
                       router_key_pdus,router_key_pdu_count,aspa_pdus,aspa_pdus_count,
                       (pdu_end_of_data_v0 *)auStack_100a8);
    goto LAB_0010a532;
  case 9:
    goto switchD_00109fc7_caseD_9;
  case 10:
    rtr_handle_error_pdu(rtr_socket,auStack_100a8);
    goto LAB_0010a52f;
  case 0xb:
    if (ppVar3 <= aspa_pdus_count) {
      pppVar4 = (pdu_aspa **)lrtr_realloc(aspa_pdus,(long)ppVar3 * 8 + 800);
      if (pppVar4 != (pdu_aspa **)0x0) {
        ppVar3 = (pfx_table *)((long)&ppVar3[1].update_fp + 4);
        aspa_pdus = pppVar4;
        goto LAB_0010a07c;
      }
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[1]._0_6_ = 0x64656c696166;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[1]._6_1_ = 0;
      uVar7 = 0x20636f6c6c616552;
LAB_0010a503:
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._0_6_ = (undefined6)uVar7;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._6_1_ =
           (undefined1)((ulong)uVar7 >> 0x30);
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._7_1_ =
           (undefined1)((ulong)uVar7 >> 0x38);
      lrtr_dbg("RTR Socket: %s");
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      goto LAB_0010a524;
    }
LAB_0010a07c:
    size = (ulong)(ushort)auStack_100a8._10_2_ * 4 + 0x10;
    __dest = (pdu_aspa *)lrtr_malloc(size);
    if (__dest == (pdu_aspa *)0x0) {
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[1]._0_6_ = 0x64656c6961;
      uVar7 = 0x6620636f6c6c614d;
      goto LAB_0010a503;
    }
    memcpy(__dest,auStack_100a8,size);
    aspa_pdus[aspa_pdus_count] = __dest;
    ppVar8 = (pfx_table *)(aspa_pdus_count + 1);
    aspa_pdus_count = (size_t)ppVar8;
    goto LAB_00109f4c;
  }
  iVar2 = rtr_store_prefix_pdu(rtr_socket,auStack_100a8,pdu_size,&ppVar8->ipv4,ind,size_00);
  if (iVar2 == -1) {
LAB_0010a524:
    new_state = RTR_ERROR_FATAL;
    goto LAB_0010a52a;
  }
  goto LAB_00109f4c;
switchD_00109fc7_caseD_9:
  ppVar5 = router_key_pdus;
  if (uVar10 <= router_key_pdu_count) {
    uVar10 = uVar10 + 100;
    ppVar5 = (pdu_router_key *)lrtr_realloc(router_key_pdus,(ulong)(uVar10 * 0x7b));
    if (ppVar5 == (pdu_router_key *)0x0) {
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[1]._0_6_ = 0x64656c696166;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[1]._6_1_ = 0;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._0_6_ = 0x6f6c6c616552;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._6_1_ = 99;
      __cancel_buf.__cancel_jmp_buf[0].__cancel_jmp_buf[0]._7_1_ = 0x20;
      lrtr_dbg("RTR Socket: %s");
      new_state = RTR_ERROR_FATAL;
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
LAB_0010a52a:
      rtr_change_socket_state(rtr_socket,new_state);
LAB_0010a52f:
      iVar2 = -1;
LAB_0010a532:
      recv_loop_cleanup(&cleanup_args);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return iVar2;
    }
  }
  router_key_pdus = ppVar5;
  memcpy(router_key_pdus + (long)ppVar9,auStack_100a8,0x7b);
  ppVar8 = (pfx_table *)(ulong)uVar10;
  ppVar9 = (pfx_table *)(ulong)(router_key_pdu_count + 1);
  goto LAB_00109f3f;
}

Assistant:

static int rtr_sync_receive_and_store_pdus(struct rtr_socket *rtr_socket)
{
	char pdu_data[RTR_MAX_PDU_LEN];
	enum pdu_type type;
	int retval = RTR_SUCCESS;

	struct pdu_ipv6 *ipv6_pdus = NULL;
	unsigned int ipv6_pdus_nindex = 0; // next free index in ipv6_pdus
	unsigned int ipv6_pdus_size = 0;

	struct pdu_ipv4 *ipv4_pdus = NULL;
	unsigned int ipv4_pdus_size = 0;
	unsigned int ipv4_pdus_nindex = 0; // next free index in ipv4_pdus

	struct pdu_router_key *router_key_pdus = NULL;
	unsigned int router_key_pdus_size = 0;
	unsigned int router_key_pdus_nindex = 0;

	struct pdu_aspa **aspa_pdus = NULL;
	size_t aspa_pdus_capacity = 0;
	size_t aspa_pdus_count = 0;

	int oldcancelstate;
	struct recv_loop_cleanup_args cleanup_args = {.ipv4_pdus = &ipv4_pdus,
						      .ipv6_pdus = &ipv6_pdus,
						      .router_key_pdus = &router_key_pdus,
						      .aspa_pdus = &aspa_pdus,
						      .aspa_pdu_count = &aspa_pdus_count};

	// receive LRTR_IPV4/IPV6/ASPA PDUs till EOD
	do {
		pthread_cleanup_push(recv_loop_cleanup, &cleanup_args);
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);

		// Receive PDUs, cancellable
		retval = rtr_receive_pdu(rtr_socket, pdu_data, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		pthread_cleanup_pop(0);

		if (retval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			retval = RTR_ERROR;
			break;
		} else if (retval < 0) {
			retval = RTR_ERROR;
			break;
		}

		type = rtr_get_pdu_type(pdu_data);

		switch (type) {
		case SERIAL_NOTIFY:
			RTR_DBG1("Ignoring Serial Notify");
			break;

		case IPV4_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv4_pdus), (void **)&ipv4_pdus,
						 &ipv4_pdus_nindex, &ipv4_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case IPV6_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv6_pdus), (void **)&ipv6_pdus,
						 &ipv6_pdus_nindex, &ipv6_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ROUTER_KEY:
			// Temporarily store router key PDU, handle later after EOD PDU has been received
			if (rtr_store_router_key_pdu(rtr_socket, pdu_data, sizeof(*router_key_pdus), &router_key_pdus,
						     &router_key_pdus_nindex, &router_key_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ASPA:
			// Temporarily store ASPA PDU, handle later after EOD PDU has been received
			if (rtr_store_aspa_pdu(rtr_socket, (struct pdu_aspa *)pdu_data, &aspa_pdus, &aspa_pdus_count,
					       &aspa_pdus_capacity) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ERROR:
			rtr_handle_error_pdu(rtr_socket, pdu_data);
			retval = RTR_ERROR;
			break;

		case EOD:
			RTR_DBG1("EOD PDU received.");
			struct pdu_end_of_data_v0 *eod_pdu = (struct pdu_end_of_data_v0 *)pdu_data;

			retval = rtr_handle_eod_pdu(rtr_socket, eod_pdu, pdu_data);
			if (retval != RTR_SUCCESS)
				break;

			if (rtr_socket->is_resetting) {
				// Use table copies instead in order to perform an atomic update
				RTR_DBG1("Reset in progress creating shadow table for atomic reset");

				struct pfx_table *pfx_shadow_table = lrtr_malloc(sizeof(struct pfx_table));

				if (!pfx_shadow_table) {
					RTR_DBG1("Memory allocation for pfx shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				pfx_table_init(pfx_shadow_table, NULL);
				if (pfx_table_copy_except_socket(rtr_socket->pfx_table, pfx_shadow_table, rtr_socket) !=
				    PFX_SUCCESS) {
					RTR_DBG1("Creation of pfx shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct spki_table *spki_shadow_table = lrtr_malloc(sizeof(struct spki_table));

				if (!spki_shadow_table) {
					RTR_DBG1("Memory allocation for spki shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				spki_table_init(spki_shadow_table, NULL);
				if (spki_table_copy_except_socket(rtr_socket->spki_table, spki_shadow_table,
								  rtr_socket) != SPKI_SUCCESS) {
					RTR_DBG1("Creation of spki shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct aspa_table *aspa_shadow_table = lrtr_malloc(sizeof(struct aspa_table));

				if (!aspa_shadow_table) {
					RTR_DBG1("Memory allocation for aspa shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				aspa_table_init(aspa_shadow_table, NULL);

				RTR_DBG1("Shadow tables created");

				retval = rtr_sync_update_tables(rtr_socket, pfx_shadow_table, spki_shadow_table,
								aspa_shadow_table, ipv4_pdus, ipv4_pdus_nindex,
								ipv6_pdus, ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);

				if (retval == RTR_SUCCESS) {
					RTR_DBG1("Reset finished. Swapping new table in.");
					pfx_table_swap(rtr_socket->pfx_table, pfx_shadow_table);
					spki_table_swap(rtr_socket->spki_table, spki_shadow_table);

					// No need to notify shadow table's clients as it hasn't any.
					RTR_DBG1("Replacing ASPA records");
					aspa_table_src_replace(rtr_socket->aspa_table, aspa_shadow_table, rtr_socket,
							       !!rtr_socket->aspa_table->update_fp, false);

					if (rtr_socket->pfx_table->update_fp) {
						RTR_DBG1("Calculating and notifying pfx diff");
						pfx_table_notify_diff(rtr_socket->pfx_table, pfx_shadow_table,
								      rtr_socket);
					} else {
						RTR_DBG1("No pfx update callback. Skipping diff");
					}

					if (rtr_socket->spki_table->update_fp) {
						RTR_DBG1("Calculating and notifying spki diff");
						spki_table_notify_diff(rtr_socket->spki_table, spki_shadow_table,
								       rtr_socket);
					} else {
						RTR_DBG1("No spki update callback. Skipping diff");
					}
				}

			cleanup:
				RTR_DBG1("Freeing shadow tables.");
				if (pfx_shadow_table) {
					pfx_table_free_without_notify(pfx_shadow_table);
					lrtr_free(pfx_shadow_table);
				}

				if (spki_shadow_table) {
					spki_table_free_without_notify(spki_shadow_table);
					lrtr_free(spki_shadow_table);
				}

				if (aspa_shadow_table) {
					aspa_table_free(aspa_shadow_table, false);
					lrtr_free(aspa_shadow_table);
				}

				rtr_socket->is_resetting = false;
			} else {
				retval = rtr_sync_update_tables(rtr_socket, rtr_socket->pfx_table,
								rtr_socket->spki_table, rtr_socket->aspa_table,
								ipv4_pdus, ipv4_pdus_nindex, ipv6_pdus,
								ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);
			}

			break;

		default:
			RTR_DBG("Received unexpected PDU (Type: %u)", ((struct pdu_header *)pdu_data)->type);
			const char txt[] = "Unexpected PDU received during data synchronisation";

			rtr_send_error_pdu_from_host(rtr_socket, pdu_data, sizeof(struct pdu_header), CORRUPT_DATA, txt,
						     sizeof(txt));
			retval = RTR_ERROR;
			break;
		}
	} while (type != EOD && retval != RTR_ERROR);

	recv_loop_cleanup(&cleanup_args);
	return retval;
}